

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddSubDirectoryCommand.cxx
# Opt level: O3

bool __thiscall
cmAddSubDirectoryCommand::InitialPass
          (cmAddSubDirectoryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long *plVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pbVar5;
  pointer pbVar6;
  size_type sVar7;
  bool bVar8;
  int iVar9;
  char *__s;
  size_t sVar10;
  char *pcVar11;
  ostream *poVar12;
  long lVar13;
  undefined8 *puVar14;
  undefined8 uVar15;
  ulong uVar16;
  pointer pbVar17;
  string srcPath;
  string binArg;
  string binPath;
  string error;
  bool local_24c;
  string local_248;
  string local_228;
  char *local_208;
  long local_200;
  char local_1f8;
  undefined7 uStack_1f7;
  string local_1e8;
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8 [2];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pbVar5 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar6 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar5 == pbVar6) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    return false;
  }
  local_208 = &local_1f8;
  local_200 = 0;
  local_1f8 = '\0';
  pbVar17 = pbVar5 + 1;
  if (pbVar17 == pbVar6) {
    local_24c = false;
  }
  else {
    local_24c = false;
    do {
      iVar9 = std::__cxx11::string::compare((char *)pbVar17);
      if (iVar9 == 0) {
        local_24c = true;
      }
      else {
        if (local_200 != 0) {
          local_1a8._0_8_ = local_1a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,"called with incorrect number of arguments","");
          cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          bVar8 = false;
          goto LAB_002e3ec9;
        }
        std::__cxx11::string::_M_assign((string *)&local_208);
      }
      pbVar17 = pbVar17 + 1;
    } while (pbVar17 !=
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  local_248._M_string_length = 0;
  local_248.field_2._M_local_buf[0] = '\0';
  bVar8 = cmsys::SystemTools::FileIsFullPath((pbVar5->_M_dataplus)._M_p);
  if (bVar8) {
    std::__cxx11::string::_M_assign((string *)&local_248);
  }
  else {
    pcVar11 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    sVar7 = local_248._M_string_length;
    strlen(pcVar11);
    std::__cxx11::string::_M_replace((ulong)&local_248,0,(char *)sVar7,(ulong)pcVar11);
    std::__cxx11::string::append((char *)&local_248);
    std::__cxx11::string::_M_append((char *)&local_248,(ulong)(pbVar5->_M_dataplus)._M_p);
  }
  bVar8 = cmsys::SystemTools::FileIsDirectory(&local_248);
  if (!bVar8) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"given source \"","");
    std::__cxx11::string::_M_append(local_1a8,(ulong)(pbVar5->_M_dataplus)._M_p);
    std::__cxx11::string::append(local_1a8);
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    bVar8 = false;
    goto LAB_002e3eb2;
  }
  cmsys::SystemTools::CollapseFullPath((string *)local_1a8,&local_248);
  std::__cxx11::string::operator=((string *)&local_248,(string *)local_1a8);
  plVar3 = (long *)(local_1a8 + 0x10);
  if ((long *)local_1a8._0_8_ != plVar3) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  paVar4 = &local_1e8.field_2;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  local_1e8._M_dataplus._M_p = (pointer)paVar4;
  if (local_200 == 0) {
    pcVar11 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    std::__cxx11::string::string((string *)local_1a8,pcVar11,(allocator *)&local_228);
    bVar8 = cmsys::SystemTools::IsSubDirectory(&local_248,(string *)local_1a8);
    if ((long *)local_1a8._0_8_ != plVar3) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (bVar8) {
      pcVar11 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      __s = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
      strlen(pcVar11);
      sVar10 = strlen(__s);
      if (sVar10 == 0) {
        lVar13 = 0;
      }
      else {
        lVar13 = sVar10 - (__s[sVar10 - 1] == '/');
      }
      paVar2 = &local_228.field_2;
      local_228._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,__s,__s + lVar13);
      std::__cxx11::string::substr((ulong)&local_1c8,(ulong)&local_248);
      uVar15 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != paVar2) {
        uVar15 = local_228.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < local_1c0 + local_228._M_string_length) {
        uVar16 = 0xf;
        if (local_1c8 != local_1b8) {
          uVar16 = local_1b8[0];
        }
        if (uVar16 < local_1c0 + local_228._M_string_length) goto LAB_002e3c9b;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_1c8,0,(char *)0x0,(ulong)local_228._M_dataplus._M_p);
      }
      else {
LAB_002e3c9b:
        puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_1c8)
        ;
      }
      psVar1 = puVar14 + 2;
      if ((size_type *)*puVar14 == psVar1) {
        local_1a8._16_8_ = *psVar1;
        local_1a8._24_8_ = puVar14[3];
        local_1a8._0_8_ = plVar3;
      }
      else {
        local_1a8._16_8_ = *psVar1;
        local_1a8._0_8_ = (size_type *)*puVar14;
      }
      local_1a8._8_8_ = puVar14[1];
      *puVar14 = psVar1;
      puVar14[1] = 0;
      *(undefined1 *)psVar1 = 0;
      std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
      if ((long *)local_1a8._0_8_ != plVar3) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != paVar2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      goto LAB_002e3e31;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"not given a binary directory but the given source directory ",
               0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_248._M_dataplus._M_p,local_248._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,"\" is not a subdirectory of \"",0x1c);
    pcVar11 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    if (pcVar11 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)poVar12->_vptr_basic_ostream[-3]);
    }
    else {
      sVar10 = strlen(pcVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar11,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\".  ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,"When specifying an out-of-tree source a binary directory ",0x39);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"must be explicitly specified.",0x1d)
    ;
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar8 = false;
  }
  else {
    bVar8 = cmsys::SystemTools::FileIsFullPath(local_208);
    if (bVar8) {
      std::__cxx11::string::_M_assign((string *)&local_1e8);
    }
    else {
      pcVar11 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
      sVar7 = local_1e8._M_string_length;
      strlen(pcVar11);
      std::__cxx11::string::_M_replace((ulong)&local_1e8,0,(char *)sVar7,(ulong)pcVar11);
      std::__cxx11::string::append((char *)&local_1e8);
      std::__cxx11::string::_M_append((char *)&local_1e8,(ulong)local_208);
    }
LAB_002e3e31:
    cmsys::SystemTools::CollapseFullPath((string *)local_1a8,&local_1e8);
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    bVar8 = true;
    cmMakefile::AddSubDirectory
              ((this->super_cmCommand).Makefile,&local_248,&local_1e8,local_24c,true);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar4) {
    operator_delete(local_1e8._M_dataplus._M_p,
                    CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                             local_1e8.field_2._M_local_buf[0]) + 1);
  }
LAB_002e3eb2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                             local_248.field_2._M_local_buf[0]) + 1);
  }
LAB_002e3ec9:
  if (local_208 != &local_1f8) {
    operator_delete(local_208,CONCAT71(uStack_1f7,local_1f8) + 1);
  }
  return bVar8;
}

Assistant:

bool cmAddSubDirectoryCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // store the binpath
  std::string const& srcArg = args[0];
  std::string binArg;

  bool excludeFromAll = false;

  // process the rest of the arguments looking for optional args
  std::vector<std::string>::const_iterator i = args.begin();
  ++i;
  for (; i != args.end(); ++i) {
    if (*i == "EXCLUDE_FROM_ALL") {
      excludeFromAll = true;
      continue;
    }
    if (binArg.empty()) {
      binArg = *i;
    } else {
      this->SetError("called with incorrect number of arguments");
      return false;
    }
  }

  // Compute the full path to the specified source directory.
  // Interpret a relative path with respect to the current source directory.
  std::string srcPath;
  if (cmSystemTools::FileIsFullPath(srcArg.c_str())) {
    srcPath = srcArg;
  } else {
    srcPath = this->Makefile->GetCurrentSourceDirectory();
    srcPath += "/";
    srcPath += srcArg;
  }
  if (!cmSystemTools::FileIsDirectory(srcPath)) {
    std::string error = "given source \"";
    error += srcArg;
    error += "\" which is not an existing directory.";
    this->SetError(error);
    return false;
  }
  srcPath = cmSystemTools::CollapseFullPath(srcPath);

  // Compute the full path to the binary directory.
  std::string binPath;
  if (binArg.empty()) {
    // No binary directory was specified.  If the source directory is
    // not a subdirectory of the current directory then it is an
    // error.
    if (!cmSystemTools::IsSubDirectory(
          srcPath, this->Makefile->GetCurrentSourceDirectory())) {
      std::ostringstream e;
      e << "not given a binary directory but the given source directory "
        << "\"" << srcPath << "\" is not a subdirectory of \""
        << this->Makefile->GetCurrentSourceDirectory() << "\".  "
        << "When specifying an out-of-tree source a binary directory "
        << "must be explicitly specified.";
      this->SetError(e.str());
      return false;
    }

    // Remove the CurrentDirectory from the srcPath and replace it
    // with the CurrentOutputDirectory.
    const char* src = this->Makefile->GetCurrentSourceDirectory();
    const char* bin = this->Makefile->GetCurrentBinaryDirectory();
    size_t srcLen = strlen(src);
    size_t binLen = strlen(bin);
    if (srcLen > 0 && src[srcLen - 1] == '/') {
      --srcLen;
    }
    if (binLen > 0 && bin[binLen - 1] == '/') {
      --binLen;
    }
    binPath = std::string(bin, binLen) + srcPath.substr(srcLen);
  } else {
    // Use the binary directory specified.
    // Interpret a relative path with respect to the current binary directory.
    if (cmSystemTools::FileIsFullPath(binArg.c_str())) {
      binPath = binArg;
    } else {
      binPath = this->Makefile->GetCurrentBinaryDirectory();
      binPath += "/";
      binPath += binArg;
    }
  }
  binPath = cmSystemTools::CollapseFullPath(binPath);

  // Add the subdirectory using the computed full paths.
  this->Makefile->AddSubDirectory(srcPath, binPath, excludeFromAll, true);

  return true;
}